

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall vm::VM::Tadd<int>(VM *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  ensureStackUsed(this,1);
  iVar1 = this->_sp;
  this->_sp = iVar1 + -1;
  iVar1 = (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar1 + -1];
  ensureStackUsed(this,1);
  iVar2 = this->_sp;
  this->_sp = iVar2 + -1;
  iVar2 = (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar2 + -1];
  ensureStackRest(this,1);
  iVar3 = this->_sp;
  this->_sp = iVar3 + 1;
  (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl[iVar3] = iVar1 + iVar2;
  return;
}

Assistant:

void VM::Tadd() {
    static_assert(std::is_arithmetic_v<T>);
    auto rhs = POP<T>();
    auto lhs = POP<T>();
    PUSH(lhs+rhs);
}